

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
scanMul(AbstractingUnifier *au,Numeral *k,TermSpec t)

{
  bool bVar1;
  TermSpec *in_RDX;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RSI;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_fffffffffffffee0;
  RationalConstantType *in_stack_fffffffffffffee8;
  int *in_stack_ffffffffffffff18;
  RationalConstantType *in_stack_ffffffffffffff20;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  AbstractingUnifier *in_stack_ffffffffffffffb8;
  
  RationalConstantType::RationalConstantType
            ((RationalConstantType *)in_RDI,in_stack_fffffffffffffee8);
  uVar2 = 0;
  bVar1 = Kernel::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    zero();
    in_RSI = in_stack_fffffffffffffee0;
  }
  else {
    scan((AbstractingUnifier *)in_RSI,in_RDX);
    mul(in_stack_ffffffffffffffb8,(Numeral *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
        in_stack_ffffffffffffffa8);
    ~FloorUwaState(in_RSI);
  }
  RationalConstantType::~RationalConstantType((RationalConstantType *)in_RSI);
  return in_RDI;
}

Assistant:

static FloorUwaState scanMul(AbstractingUnifier& au, Numeral const& k, TermSpec t) 
  { return k == 0 ? FloorUwaState::zero() : mul(au, k, scan(au, t)); }